

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_tree_unit_test.cpp
# Opt level: O0

void __thiscall
simplex_tree_insertion<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>::test_method
          (simplex_tree_insertion<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_> *this)

{
  initializer_list<unsigned_long> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  initializer_list<int> __l_05;
  initializer_list<int> __l_06;
  initializer_list<int> __l_07;
  initializer_list<int> __l_08;
  initializer_list<int> __l_09;
  initializer_list<int> __l_10;
  undefined8 uVar1;
  bool bVar2;
  type_conflict3 tVar3;
  int iVar4;
  reference rVar5;
  ostream *poVar6;
  size_type sVar7;
  lazy_ostream *plVar8;
  size_t sVar9;
  void *pvVar10;
  Filtration_simplex_range *this_00;
  reference other;
  Filtration_value *pFVar11;
  Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
  SVar12;
  int vertex;
  Siblings *local_1410;
  Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
  __end0_1;
  Siblings *local_13f0;
  Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
  __begin0_1;
  iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
  local_13d8;
  iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
  *local_13b8;
  Simplex_vertex_range *__range2;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  local_13a8;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  f_simplex;
  const_iterator __end0;
  const_iterator __begin0;
  Filtration_simplex_range *__range1;
  basic_cstring<const_char> local_1370;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1360;
  allocator<unsigned_long> local_1339;
  unsigned_long local_1338 [3];
  iterator local_1320;
  size_type local_1318;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1310;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_12f8;
  assertion_result local_12e0;
  basic_cstring<const_char> local_12c8;
  basic_cstring<const_char> local_12b8;
  basic_cstring<const_char> local_12a8;
  basic_cstring<const_char> local_1298;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1288;
  assertion_result local_1268;
  basic_cstring<const_char> local_1250;
  basic_cstring<const_char> local_1240;
  basic_cstring<const_char> local_1230;
  basic_cstring<const_char> local_1220;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1210;
  assertion_result local_11f0;
  basic_cstring<const_char> local_11d8;
  basic_cstring<const_char> local_11c8;
  basic_cstring<const_char> local_11b8;
  basic_cstring<const_char> local_11a8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1198;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  local_1178;
  assertion_result local_1170;
  basic_cstring<const_char> local_1158;
  basic_cstring<const_char> local_1148;
  basic_cstring<const_char> local_1138;
  basic_cstring<const_char> local_1128;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1118;
  assertion_result local_10f8;
  basic_cstring<const_char> local_10e0;
  basic_cstring<const_char> local_10d0;
  undefined1 local_10c0 [32];
  typeSimplex eleventhSimplex;
  basic_cstring<const_char> local_1078;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1068;
  assertion_result local_1048;
  basic_cstring<const_char> local_1030;
  basic_cstring<const_char> local_1020;
  allocator<int> local_100d;
  int local_100c [3];
  iterator local_1000;
  size_type local_ff8;
  undefined1 local_ff0 [8];
  typeVectorVertex eleventhSimplexVector;
  basic_cstring<const_char> local_fc8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_fb8;
  assertion_result local_f98;
  basic_cstring<const_char> local_f80;
  basic_cstring<const_char> local_f70;
  basic_cstring<const_char> local_f60;
  basic_cstring<const_char> local_f50;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_f40;
  assertion_result local_f20;
  basic_cstring<const_char> local_f08;
  basic_cstring<const_char> local_ef8;
  basic_cstring<const_char> local_ee8;
  basic_cstring<const_char> local_ed8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_ec8;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  local_ea8;
  assertion_result local_ea0;
  basic_cstring<const_char> local_e88;
  basic_cstring<const_char> local_e78;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  local_e68;
  Simplex_handle shReturned;
  basic_cstring<const_char> local_e50;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_e40;
  assertion_result local_e20;
  basic_cstring<const_char> local_e08;
  basic_cstring<const_char> local_df8;
  undefined1 local_de8 [32];
  typeSimplex tenthSimplex;
  basic_cstring<const_char> local_da0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_d90;
  assertion_result local_d70;
  basic_cstring<const_char> local_d58;
  basic_cstring<const_char> local_d48;
  allocator<int> local_d35;
  int local_d34;
  iterator local_d30;
  size_type local_d28;
  undefined1 local_d20 [8];
  typeVectorVertex tenthSimplexVector;
  basic_cstring<const_char> local_cf8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_ce8;
  assertion_result local_cc8;
  basic_cstring<const_char> local_cb0;
  basic_cstring<const_char> local_ca0;
  undefined1 local_c90 [32];
  typeSimplex ninethSimplex;
  basic_cstring<const_char> local_c48;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_c38;
  assertion_result local_c18;
  basic_cstring<const_char> local_c00;
  basic_cstring<const_char> local_bf0;
  allocator<int> local_bd9;
  int local_bd8 [2];
  iterator local_bd0;
  size_type local_bc8;
  undefined1 local_bc0 [8];
  typeVectorVertex ninethSimplexVector;
  basic_cstring<const_char> local_b98;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_b88;
  assertion_result local_b68;
  basic_cstring<const_char> local_b50;
  basic_cstring<const_char> local_b40;
  undefined1 local_b30 [32];
  typeSimplex eighthSimplex;
  basic_cstring<const_char> local_ae8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_ad8;
  assertion_result local_ab8;
  basic_cstring<const_char> local_aa0;
  basic_cstring<const_char> local_a90;
  allocator<int> local_a7d;
  int local_a7c;
  iterator local_a78;
  size_type local_a70;
  undefined1 local_a68 [8];
  typeVectorVertex eighthSimplexVector;
  basic_cstring<const_char> local_a40;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_a30;
  assertion_result local_a10;
  basic_cstring<const_char> local_9f8;
  basic_cstring<const_char> local_9e8;
  undefined1 local_9d8 [32];
  typeSimplex seventhSimplex;
  basic_cstring<const_char> local_990;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_980;
  assertion_result local_960;
  basic_cstring<const_char> local_948;
  basic_cstring<const_char> local_938;
  allocator<int> local_925;
  int local_924 [3];
  iterator local_918;
  size_type local_910;
  undefined1 local_908 [8];
  typeVectorVertex seventhSimplexVector;
  basic_cstring<const_char> local_8e0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_8d0;
  assertion_result local_8b0;
  basic_cstring<const_char> local_898;
  basic_cstring<const_char> local_888;
  undefined1 local_878 [32];
  typeSimplex sixthSimplex;
  basic_cstring<const_char> local_830;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_820;
  assertion_result local_800;
  basic_cstring<const_char> local_7e8;
  basic_cstring<const_char> local_7d8;
  allocator<int> local_7c1;
  int local_7c0 [2];
  iterator local_7b8;
  size_type local_7b0;
  undefined1 local_7a8 [8];
  typeVectorVertex sixthSimplexVector;
  basic_cstring<const_char> local_780;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_770;
  assertion_result local_750;
  basic_cstring<const_char> local_738;
  basic_cstring<const_char> local_728;
  undefined1 local_718 [32];
  typeSimplex fifthSimplex;
  basic_cstring<const_char> local_6d0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_6c0;
  assertion_result local_6a0;
  basic_cstring<const_char> local_688;
  basic_cstring<const_char> local_678;
  allocator<int> local_661;
  int local_660 [2];
  iterator local_658;
  size_type local_650;
  undefined1 local_648 [8];
  typeVectorVertex fifthSimplexVector;
  basic_cstring<const_char> local_620;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_610;
  assertion_result local_5f0;
  basic_cstring<const_char> local_5d8;
  basic_cstring<const_char> local_5c8;
  undefined1 local_5b8 [32];
  typeSimplex fourthSimplex;
  basic_cstring<const_char> local_570;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_560;
  assertion_result local_540;
  basic_cstring<const_char> local_528;
  basic_cstring<const_char> local_518;
  allocator<int> local_505;
  int local_504;
  iterator local_500;
  size_type local_4f8;
  undefined1 local_4f0 [8];
  typeVectorVertex fourthSimplexVector;
  basic_cstring<const_char> local_4c8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_4b8;
  assertion_result local_498;
  basic_cstring<const_char> local_480;
  basic_cstring<const_char> local_470;
  undefined1 local_460 [32];
  typeSimplex thirdSimplex;
  basic_cstring<const_char> local_418;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_408;
  assertion_result local_3e8;
  basic_cstring<const_char> local_3d0;
  basic_cstring<const_char> local_3c0;
  allocator<int> local_3a9;
  int local_3a8 [2];
  iterator local_3a0;
  size_type local_398;
  undefined1 local_390 [8];
  typeVectorVertex thirdSimplexVector;
  basic_cstring<const_char> local_368;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_358;
  assertion_result local_338;
  basic_cstring<const_char> local_320;
  basic_cstring<const_char> local_310;
  undefined1 local_300 [32];
  typeSimplex secondSimplex;
  basic_cstring<const_char> local_2b8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_2a8;
  assertion_result local_288;
  basic_cstring<const_char> local_270;
  basic_cstring<const_char> local_260;
  allocator<int> local_24d;
  int local_24c;
  iterator local_248;
  size_type local_240;
  undefined1 local_238 [8];
  typeVectorVertex secondSimplexVector;
  basic_cstring<const_char> local_210;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_200;
  assertion_result local_1e0;
  basic_cstring<const_char> local_1c8;
  basic_cstring<const_char> local_1b8;
  undefined1 local_1a8 [8];
  typePairSimplexBool returnValue;
  undefined1 local_190 [8];
  typeSimplex firstSimplex;
  basic_cstring<const_char> local_160;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_150;
  assertion_result local_130;
  basic_cstring<const_char> local_118;
  basic_cstring<const_char> local_108;
  allocator<int> local_f5;
  int local_f4;
  iterator local_f0;
  size_type local_e8;
  undefined1 local_e0 [8];
  typeVectorVertex firstSimplexVector;
  undefined1 local_b8 [8];
  Simplex_tree<Gudhi::Simplex_tree_options_default> st;
  Filtration_value FOURTH_FILTRATION_VALUE;
  Filtration_value THIRD_FILTRATION_VALUE;
  Filtration_value SECOND_FILTRATION_VALUE;
  Filtration_value FIRST_FILTRATION_VALUE;
  simplex_tree_insertion<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_> *this_local;
  
  st.dimension_ = -0x66666666;
  st.dimension_to_be_lowered_ = true;
  st._133_3_ = 0x3fd999;
  dim_max = -1;
  poVar6 = std::operator<<((ostream *)&std::clog,
                           "********************************************************************");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<((ostream *)&std::clog,"TEST OF INSERTION");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::Simplex_tree
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_b8);
  poVar6 = std::operator<<((ostream *)&std::clog,"   - INSERT 0");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  local_f4 = 0;
  local_f0 = &local_f4;
  local_e8 = 1;
  std::allocator<int>::allocator(&local_f5);
  __l_10._M_len = local_e8;
  __l_10._M_array = local_f0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_e0,__l_10,&local_f5);
  std::allocator<int>::~allocator(&local_f5);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_108,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_118);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_108,0xd3,&local_118);
    sVar7 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_e0);
    boost::test_tools::assertion_result::assertion_result(&local_130,sVar7 == 1);
    plVar8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_160,"firstSimplexVector.size() == 1",0x1e);
    boost::unit_test::operator<<(&local_150,plVar8,&local_160);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&firstSimplex.second,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion
              (&local_130,&local_150,&firstSimplex.second,0xd3,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_150);
    boost::test_tools::assertion_result::~assertion_result(&local_130);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  returnValue.second = true;
  returnValue._9_7_ = 0x3fb99999999999;
  std::make_pair<std::vector<int,std::allocator<int>>&,double>
            ((pair<std::vector<int,_std::allocator<int>_>,_double> *)local_190,
             (vector<int,_std::allocator<int>_> *)local_e0,(double *)&returnValue.second);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex<std::vector<int,std::allocator<int>>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_1a8,
             (vector<int,_std::allocator<int>_> *)local_b8,(Filtration_value *)local_190);
  test_simplex_tree_insert_returns_true<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,bool>>
            ((pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
              *)local_1a8);
  sVar7 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_e0);
  set_and_test_simplex_tree_dim_fil<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,double>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_b8,(int)sVar7,
             (double *)
             &firstSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1b8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1c8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1b8,0xd9,&local_1c8);
    sVar9 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_vertices
                      ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_b8);
    boost::test_tools::assertion_result::assertion_result(&local_1e0,sVar9 == 1);
    plVar8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_210,"st.num_vertices() == (size_t) 1",0x1f);
    boost::unit_test::operator<<(&local_200,plVar8,&local_210);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               &secondSimplexVector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion
              (&local_1e0,&local_200,
               &secondSimplexVector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,0xd9,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_200);
    boost::test_tools::assertion_result::~assertion_result(&local_1e0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  poVar6 = std::operator<<((ostream *)&std::clog,"   - INSERT 1");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  local_24c = 1;
  local_248 = &local_24c;
  local_240 = 1;
  std::allocator<int>::allocator(&local_24d);
  __l_09._M_len = local_240;
  __l_09._M_array = local_248;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_238,__l_09,&local_24d);
  std::allocator<int>::~allocator(&local_24d);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_260,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_270);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_260,0xde,&local_270);
    sVar7 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_238);
    boost::test_tools::assertion_result::assertion_result(&local_288,sVar7 == 1);
    plVar8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2b8,"secondSimplexVector.size() == 1",0x1f);
    boost::unit_test::operator<<(&local_2a8,plVar8,&local_2b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&secondSimplex.second,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion
              (&local_288,&local_2a8,&secondSimplex.second,0xde,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_2a8);
    boost::test_tools::assertion_result::~assertion_result(&local_288);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_300._16_8_ = (_Hash_node_base *)0x3fb999999999999a;
  std::make_pair<std::vector<int,std::allocator<int>>&,double>
            ((pair<std::vector<int,_std::allocator<int>_>,_double> *)(local_300 + 0x18),
             (vector<int,_std::allocator<int>_> *)local_238,(double *)(local_300 + 0x10));
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex<std::vector<int,std::allocator<int>>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_300,
             (vector<int,_std::allocator<int>_> *)local_b8,(Filtration_value *)(local_300 + 0x18));
  std::
  pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
  ::operator=((pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
               *)local_1a8,(type)local_300);
  test_simplex_tree_insert_returns_true<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,bool>>
            ((pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
              *)local_1a8);
  sVar7 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_238);
  set_and_test_simplex_tree_dim_fil<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,double>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_b8,(int)sVar7,
             (double *)
             &secondSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_310,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_320);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_310,0xe4,&local_320);
    sVar9 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_vertices
                      ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_b8);
    boost::test_tools::assertion_result::assertion_result(&local_338,sVar9 == 2);
    plVar8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_368,"st.num_vertices() == (size_t) 2",0x1f);
    boost::unit_test::operator<<(&local_358,plVar8,&local_368);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               &thirdSimplexVector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion
              (&local_338,&local_358,
               &thirdSimplexVector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,0xe4,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_358);
    boost::test_tools::assertion_result::~assertion_result(&local_338);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  poVar6 = std::operator<<((ostream *)&std::clog,"   - INSERT (0,1)");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  local_3a8[0] = 0;
  local_3a8[1] = 1;
  local_3a0 = local_3a8;
  local_398 = 2;
  std::allocator<int>::allocator(&local_3a9);
  __l_08._M_len = local_398;
  __l_08._M_array = local_3a0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_390,__l_08,&local_3a9);
  std::allocator<int>::~allocator(&local_3a9);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3c0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3d0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_3c0,0xe9,&local_3d0);
    sVar7 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_390);
    boost::test_tools::assertion_result::assertion_result(&local_3e8,sVar7 == 2);
    plVar8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_418,"thirdSimplexVector.size() == 2",0x1e);
    boost::unit_test::operator<<(&local_408,plVar8,&local_418);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&thirdSimplex.second,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion
              (&local_3e8,&local_408,&thirdSimplex.second,0xe9,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_408);
    boost::test_tools::assertion_result::~assertion_result(&local_3e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_460._16_8_ = (_Hash_node_base *)0x3fc999999999999a;
  std::make_pair<std::vector<int,std::allocator<int>>&,double>
            ((pair<std::vector<int,_std::allocator<int>_>,_double> *)(local_460 + 0x18),
             (vector<int,_std::allocator<int>_> *)local_390,(double *)(local_460 + 0x10));
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex<std::vector<int,std::allocator<int>>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_460,
             (vector<int,_std::allocator<int>_> *)local_b8,(Filtration_value *)(local_460 + 0x18));
  std::
  pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
  ::operator=((pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
               *)local_1a8,(type)local_460);
  test_simplex_tree_insert_returns_true<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,bool>>
            ((pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
              *)local_1a8);
  sVar7 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_390);
  set_and_test_simplex_tree_dim_fil<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,double>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_b8,(int)sVar7,
             (double *)
             &thirdSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_470,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_480);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_470,0xef,&local_480);
    sVar9 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_vertices
                      ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_b8);
    boost::test_tools::assertion_result::assertion_result(&local_498,sVar9 == 2);
    plVar8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4c8,"st.num_vertices() == (size_t) 2",0x1f);
    boost::unit_test::operator<<(&local_4b8,plVar8,&local_4c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               &fourthSimplexVector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion
              (&local_498,&local_4b8,
               &fourthSimplexVector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,0xef,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_4b8);
    boost::test_tools::assertion_result::~assertion_result(&local_498);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  poVar6 = std::operator<<((ostream *)&std::clog,"   - INSERT 2");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  local_504 = 2;
  local_500 = &local_504;
  local_4f8 = 1;
  std::allocator<int>::allocator(&local_505);
  __l_07._M_len = local_4f8;
  __l_07._M_array = local_500;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_4f0,__l_07,&local_505);
  std::allocator<int>::~allocator(&local_505);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_518,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_528);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_518,0xf4,&local_528);
    sVar7 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_4f0);
    boost::test_tools::assertion_result::assertion_result(&local_540,sVar7 == 1);
    plVar8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_570,"fourthSimplexVector.size() == 1",0x1f);
    boost::unit_test::operator<<(&local_560,plVar8,&local_570);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&fourthSimplex.second,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion
              (&local_540,&local_560,&fourthSimplex.second,0xf4,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_560);
    boost::test_tools::assertion_result::~assertion_result(&local_540);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_5b8._16_8_ = (_Hash_node_base *)0x3fb999999999999a;
  std::make_pair<std::vector<int,std::allocator<int>>&,double>
            ((pair<std::vector<int,_std::allocator<int>_>,_double> *)(local_5b8 + 0x18),
             (vector<int,_std::allocator<int>_> *)local_4f0,(double *)(local_5b8 + 0x10));
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex<std::vector<int,std::allocator<int>>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_5b8,
             (vector<int,_std::allocator<int>_> *)local_b8,(Filtration_value *)(local_5b8 + 0x18));
  std::
  pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
  ::operator=((pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
               *)local_1a8,(type)local_5b8);
  test_simplex_tree_insert_returns_true<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,bool>>
            ((pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
              *)local_1a8);
  sVar7 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_4f0);
  set_and_test_simplex_tree_dim_fil<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,double>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_b8,(int)sVar7,
             (double *)
             &fourthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5c8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_5d8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_5c8,0xfa,&local_5d8);
    sVar9 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_vertices
                      ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_b8);
    boost::test_tools::assertion_result::assertion_result(&local_5f0,sVar9 == 3);
    plVar8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_620,"st.num_vertices() == (size_t) 3",0x1f);
    boost::unit_test::operator<<(&local_610,plVar8,&local_620);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               &fifthSimplexVector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion
              (&local_5f0,&local_610,
               &fifthSimplexVector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,0xfa,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_610);
    boost::test_tools::assertion_result::~assertion_result(&local_5f0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  poVar6 = std::operator<<((ostream *)&std::clog,"   - INSERT (2,0)");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  local_660[0] = 2;
  local_660[1] = 0;
  local_658 = local_660;
  local_650 = 2;
  std::allocator<int>::allocator(&local_661);
  __l_06._M_len = local_650;
  __l_06._M_array = local_658;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_648,__l_06,&local_661);
  std::allocator<int>::~allocator(&local_661);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_678,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_688);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_678,0xff,&local_688);
    sVar7 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_648);
    boost::test_tools::assertion_result::assertion_result(&local_6a0,sVar7 == 2);
    plVar8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6d0,"fifthSimplexVector.size() == 2",0x1e);
    boost::unit_test::operator<<(&local_6c0,plVar8,&local_6d0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&fifthSimplex.second,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion
              (&local_6a0,&local_6c0,&fifthSimplex.second,0xff,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_6c0);
    boost::test_tools::assertion_result::~assertion_result(&local_6a0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_718._16_8_ = (_Hash_node_base *)0x3fc999999999999a;
  std::make_pair<std::vector<int,std::allocator<int>>&,double>
            ((pair<std::vector<int,_std::allocator<int>_>,_double> *)(local_718 + 0x18),
             (vector<int,_std::allocator<int>_> *)local_648,(double *)(local_718 + 0x10));
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex<std::vector<int,std::allocator<int>>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_718,
             (vector<int,_std::allocator<int>_> *)local_b8,(Filtration_value *)(local_718 + 0x18));
  std::
  pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
  ::operator=((pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
               *)local_1a8,(type)local_718);
  test_simplex_tree_insert_returns_true<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,bool>>
            ((pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
              *)local_1a8);
  sVar7 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_648);
  set_and_test_simplex_tree_dim_fil<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,double>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_b8,(int)sVar7,
             (double *)
             &fifthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_728,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_738);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_728,0x105,&local_738);
    sVar9 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_vertices
                      ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_b8);
    boost::test_tools::assertion_result::assertion_result(&local_750,sVar9 == 3);
    plVar8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_780,"st.num_vertices() == (size_t) 3",0x1f);
    boost::unit_test::operator<<(&local_770,plVar8,&local_780);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               &sixthSimplexVector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion
              (&local_750,&local_770,
               &sixthSimplexVector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,0x105,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_770);
    boost::test_tools::assertion_result::~assertion_result(&local_750);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  poVar6 = std::operator<<((ostream *)&std::clog,"   - INSERT (2,1)");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  local_7c0[0] = 2;
  local_7c0[1] = 1;
  local_7b8 = local_7c0;
  local_7b0 = 2;
  std::allocator<int>::allocator(&local_7c1);
  __l_05._M_len = local_7b0;
  __l_05._M_array = local_7b8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_7a8,__l_05,&local_7c1);
  std::allocator<int>::~allocator(&local_7c1);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_7e8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_7d8,0x10a,&local_7e8);
    sVar7 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_7a8);
    boost::test_tools::assertion_result::assertion_result(&local_800,sVar7 == 2);
    plVar8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_830,"sixthSimplexVector.size() == 2",0x1e);
    boost::unit_test::operator<<(&local_820,plVar8,&local_830);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&sixthSimplex.second,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion
              (&local_800,&local_820,&sixthSimplex.second,0x10a,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_820);
    boost::test_tools::assertion_result::~assertion_result(&local_800);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_878._16_8_ = (_Hash_node_base *)0x3fc999999999999a;
  std::make_pair<std::vector<int,std::allocator<int>>&,double>
            ((pair<std::vector<int,_std::allocator<int>_>,_double> *)(local_878 + 0x18),
             (vector<int,_std::allocator<int>_> *)local_7a8,(double *)(local_878 + 0x10));
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex<std::vector<int,std::allocator<int>>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_878,
             (vector<int,_std::allocator<int>_> *)local_b8,(Filtration_value *)(local_878 + 0x18));
  std::
  pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
  ::operator=((pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
               *)local_1a8,(type)local_878);
  test_simplex_tree_insert_returns_true<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,bool>>
            ((pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
              *)local_1a8);
  sVar7 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_7a8);
  set_and_test_simplex_tree_dim_fil<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,double>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_b8,(int)sVar7,
             (double *)
             &sixthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_888,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_898);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_888,0x110,&local_898);
    sVar9 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_vertices
                      ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_b8);
    boost::test_tools::assertion_result::assertion_result(&local_8b0,sVar9 == 3);
    plVar8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_8e0,"st.num_vertices() == (size_t) 3",0x1f);
    boost::unit_test::operator<<(&local_8d0,plVar8,&local_8e0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               &seventhSimplexVector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion
              (&local_8b0,&local_8d0,
               &seventhSimplexVector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,0x110,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_8d0);
    boost::test_tools::assertion_result::~assertion_result(&local_8b0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  poVar6 = std::operator<<((ostream *)&std::clog,"   - INSERT (2,1,0)");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  local_924[0] = 2;
  local_924[1] = 1;
  local_924[2] = 0;
  local_918 = local_924;
  local_910 = 3;
  std::allocator<int>::allocator(&local_925);
  __l_04._M_len = local_910;
  __l_04._M_array = local_918;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_908,__l_04,&local_925);
  std::allocator<int>::~allocator(&local_925);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_938,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_948);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_938,0x115,&local_948);
    sVar7 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_908);
    boost::test_tools::assertion_result::assertion_result(&local_960,sVar7 == 3);
    plVar8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_990,"seventhSimplexVector.size() == 3",0x20);
    boost::unit_test::operator<<(&local_980,plVar8,&local_990);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&seventhSimplex.second,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion
              (&local_960,&local_980,&seventhSimplex.second,0x115,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_980);
    boost::test_tools::assertion_result::~assertion_result(&local_960);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_9d8._16_8_ = (_Hash_node_base *)0x3fd3333333333333;
  std::make_pair<std::vector<int,std::allocator<int>>&,double>
            ((pair<std::vector<int,_std::allocator<int>_>,_double> *)(local_9d8 + 0x18),
             (vector<int,_std::allocator<int>_> *)local_908,(double *)(local_9d8 + 0x10));
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex<std::vector<int,std::allocator<int>>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_9d8,
             (vector<int,_std::allocator<int>_> *)local_b8,(Filtration_value *)(local_9d8 + 0x18));
  std::
  pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
  ::operator=((pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
               *)local_1a8,(type)local_9d8);
  test_simplex_tree_insert_returns_true<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,bool>>
            ((pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
              *)local_1a8);
  sVar7 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_908);
  set_and_test_simplex_tree_dim_fil<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,double>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_b8,(int)sVar7,
             (double *)
             &seventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9e8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_9f8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_9e8,0x11b,&local_9f8);
    sVar9 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_vertices
                      ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_b8);
    boost::test_tools::assertion_result::assertion_result(&local_a10,sVar9 == 3);
    plVar8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a40,"st.num_vertices() == (size_t) 3",0x1f);
    boost::unit_test::operator<<(&local_a30,plVar8,&local_a40);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               &eighthSimplexVector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion
              (&local_a10,&local_a30,
               &eighthSimplexVector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,0x11b,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_a30);
    boost::test_tools::assertion_result::~assertion_result(&local_a10);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  poVar6 = std::operator<<((ostream *)&std::clog,"   - INSERT 3");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  local_a7c = 3;
  local_a78 = &local_a7c;
  local_a70 = 1;
  std::allocator<int>::allocator(&local_a7d);
  __l_03._M_len = local_a70;
  __l_03._M_array = local_a78;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_a68,__l_03,&local_a7d);
  std::allocator<int>::~allocator(&local_a7d);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a90,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_aa0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_a90,0x120,&local_aa0);
    sVar7 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_a68);
    boost::test_tools::assertion_result::assertion_result(&local_ab8,sVar7 == 1);
    plVar8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ae8,"eighthSimplexVector.size() == 1",0x1f);
    boost::unit_test::operator<<(&local_ad8,plVar8,&local_ae8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&eighthSimplex.second,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion
              (&local_ab8,&local_ad8,&eighthSimplex.second,0x120,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_ad8);
    boost::test_tools::assertion_result::~assertion_result(&local_ab8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_b30._16_8_ = (_Hash_node_base *)0x3fb999999999999a;
  std::make_pair<std::vector<int,std::allocator<int>>&,double>
            ((pair<std::vector<int,_std::allocator<int>_>,_double> *)(local_b30 + 0x18),
             (vector<int,_std::allocator<int>_> *)local_a68,(double *)(local_b30 + 0x10));
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex<std::vector<int,std::allocator<int>>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_b30,
             (vector<int,_std::allocator<int>_> *)local_b8,(Filtration_value *)(local_b30 + 0x18));
  std::
  pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
  ::operator=((pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
               *)local_1a8,(type)local_b30);
  test_simplex_tree_insert_returns_true<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,bool>>
            ((pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
              *)local_1a8);
  sVar7 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_a68);
  set_and_test_simplex_tree_dim_fil<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,double>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_b8,(int)sVar7,
             (double *)
             &eighthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b40,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_b50);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_b40,0x126,&local_b50);
    sVar9 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_vertices
                      ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_b8);
    boost::test_tools::assertion_result::assertion_result(&local_b68,sVar9 == 4);
    plVar8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b98,"st.num_vertices() == (size_t) 4",0x1f);
    boost::unit_test::operator<<(&local_b88,plVar8,&local_b98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               &ninethSimplexVector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion
              (&local_b68,&local_b88,
               &ninethSimplexVector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,0x126,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_b88);
    boost::test_tools::assertion_result::~assertion_result(&local_b68);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  poVar6 = std::operator<<((ostream *)&std::clog,"   - INSERT (3,0)");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  local_bd8[0] = 3;
  local_bd8[1] = 0;
  local_bd0 = local_bd8;
  local_bc8 = 2;
  std::allocator<int>::allocator(&local_bd9);
  __l_02._M_len = local_bc8;
  __l_02._M_array = local_bd0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_bc0,__l_02,&local_bd9);
  std::allocator<int>::~allocator(&local_bd9);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_bf0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_c00);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_bf0,299,&local_c00);
    sVar7 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_bc0);
    boost::test_tools::assertion_result::assertion_result(&local_c18,sVar7 == 2);
    plVar8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c48,"ninethSimplexVector.size() == 2",0x1f);
    boost::unit_test::operator<<(&local_c38,plVar8,&local_c48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&ninethSimplex.second,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion
              (&local_c18,&local_c38,&ninethSimplex.second,299,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_c38);
    boost::test_tools::assertion_result::~assertion_result(&local_c18);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_c90._16_8_ = (_Hash_node_base *)0x3fc999999999999a;
  std::make_pair<std::vector<int,std::allocator<int>>&,double>
            ((pair<std::vector<int,_std::allocator<int>_>,_double> *)(local_c90 + 0x18),
             (vector<int,_std::allocator<int>_> *)local_bc0,(double *)(local_c90 + 0x10));
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex<std::vector<int,std::allocator<int>>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_c90,
             (vector<int,_std::allocator<int>_> *)local_b8,(Filtration_value *)(local_c90 + 0x18));
  std::
  pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
  ::operator=((pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
               *)local_1a8,(type)local_c90);
  test_simplex_tree_insert_returns_true<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,bool>>
            ((pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
              *)local_1a8);
  sVar7 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_bc0);
  set_and_test_simplex_tree_dim_fil<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,double>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_b8,(int)sVar7,
             (double *)
             &ninethSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ca0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_cb0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_ca0,0x131,&local_cb0);
    sVar9 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_vertices
                      ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_b8);
    boost::test_tools::assertion_result::assertion_result(&local_cc8,sVar9 == 4);
    plVar8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_cf8,"st.num_vertices() == (size_t) 4",0x1f);
    boost::unit_test::operator<<(&local_ce8,plVar8,&local_cf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               &tenthSimplexVector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion
              (&local_cc8,&local_ce8,
               &tenthSimplexVector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,0x131,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_ce8);
    boost::test_tools::assertion_result::~assertion_result(&local_cc8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  poVar6 = std::operator<<((ostream *)&std::clog,"   - INSERT 0 (already inserted)");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  local_d34 = 0;
  local_d30 = &local_d34;
  local_d28 = 1;
  std::allocator<int>::allocator(&local_d35);
  __l_01._M_len = local_d28;
  __l_01._M_array = local_d30;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_d20,__l_01,&local_d35);
  std::allocator<int>::~allocator(&local_d35);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d48,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_d58);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_d48,0x136,&local_d58);
    sVar7 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_d20);
    boost::test_tools::assertion_result::assertion_result(&local_d70,sVar7 == 1);
    plVar8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_da0,"tenthSimplexVector.size() == 1",0x1e);
    boost::unit_test::operator<<(&local_d90,plVar8,&local_da0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&tenthSimplex.second,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion
              (&local_d70,&local_d90,&tenthSimplex.second,0x136,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_d90);
    boost::test_tools::assertion_result::~assertion_result(&local_d70);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_de8._16_8_ = (_Hash_node_base *)0x3fd999999999999a;
  std::make_pair<std::vector<int,std::allocator<int>>&,double>
            ((pair<std::vector<int,_std::allocator<int>_>,_double> *)(local_de8 + 0x18),
             (vector<int,_std::allocator<int>_> *)local_d20,(double *)(local_de8 + 0x10));
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex<std::vector<int,std::allocator<int>>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_de8,
             (vector<int,_std::allocator<int>_> *)local_b8,(Filtration_value *)(local_de8 + 0x18));
  std::
  pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
  ::operator=((pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
               *)local_1a8,(type)local_de8);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_df8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_e08);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_df8,0x13b,&local_e08);
    boost::test_tools::assertion_result::assertion_result
              (&local_e20,(bool)(~(byte)returnValue.first.m_ptr & 1));
    plVar8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e50,"returnValue.second == false",0x1b);
    boost::unit_test::operator<<(&local_e40,plVar8,&local_e50);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&shReturned,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion(&local_e20,&local_e40,&shReturned,0x13b,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_e40);
    boost::test_tools::assertion_result::~assertion_result(&local_e20);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  boost::container::
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  ::vec_iterator(&local_e68,
                 (vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                  *)local_1a8);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e78,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_e88);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_e78,0x13e,&local_e88);
    Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::null_simplex();
    bVar2 = boost::container::operator==(&local_e68,&local_ea8);
    boost::test_tools::assertion_result::assertion_result(&local_ea0,bVar2);
    plVar8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ed8,"shReturned == typeST::null_simplex()",0x24);
    boost::unit_test::operator<<(&local_ec8,plVar8,&local_ed8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ee8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion(&local_ea0,&local_ec8,&local_ee8,0x13e,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_ec8);
    boost::test_tools::assertion_result::~assertion_result(&local_ea0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  poVar6 = std::operator<<((ostream *)&std::clog,"st.num_vertices()=");
  sVar9 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_vertices
                    ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_b8);
  pvVar10 = (void *)std::ostream::operator<<(poVar6,sVar9);
  std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ef8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_f08);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_ef8,0x140,&local_f08);
    sVar9 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_vertices
                      ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_b8);
    boost::test_tools::assertion_result::assertion_result(&local_f20,sVar9 == 4);
    plVar8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f50,"st.num_vertices() == (size_t) 4",0x1f);
    boost::unit_test::operator<<(&local_f40,plVar8,&local_f50);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f60,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion(&local_f20,&local_f40,&local_f60,0x140,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_f40);
    boost::test_tools::assertion_result::~assertion_result(&local_f20);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f70,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_f80);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_f70,0x141,&local_f80);
    iVar4 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::dimension
                      ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_b8);
    boost::test_tools::assertion_result::assertion_result(&local_f98,iVar4 == dim_max);
    plVar8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_fc8,"st.dimension() == dim_max",0x19);
    boost::unit_test::operator<<(&local_fb8,plVar8,&local_fc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               &eleventhSimplexVector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion
              (&local_f98,&local_fb8,
               &eleventhSimplexVector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,0x141,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_fb8);
    boost::test_tools::assertion_result::~assertion_result(&local_f98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  poVar6 = std::operator<<((ostream *)&std::clog,"   - INSERT (2,1,0) (already inserted)");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  local_100c[0] = 2;
  local_100c[1] = 1;
  local_100c[2] = 0;
  local_1000 = local_100c;
  local_ff8 = 3;
  std::allocator<int>::allocator(&local_100d);
  __l_00._M_len = local_ff8;
  __l_00._M_array = local_1000;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_ff0,__l_00,&local_100d);
  std::allocator<int>::~allocator(&local_100d);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1020,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1030);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1020,0x146,&local_1030);
    sVar7 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_ff0);
    boost::test_tools::assertion_result::assertion_result(&local_1048,sVar7 == 3);
    plVar8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1078,"eleventhSimplexVector.size() == 3",0x21);
    boost::unit_test::operator<<(&local_1068,plVar8,&local_1078);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&eleventhSimplex.second,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion
              (&local_1048,&local_1068,&eleventhSimplex.second,0x146,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1068);
    boost::test_tools::assertion_result::~assertion_result(&local_1048);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_10c0._16_8_ = (_Hash_node_base *)0x3fd999999999999a;
  std::make_pair<std::vector<int,std::allocator<int>>&,double>
            ((pair<std::vector<int,_std::allocator<int>_>,_double> *)(local_10c0 + 0x18),
             (vector<int,_std::allocator<int>_> *)local_ff0,(double *)(local_10c0 + 0x10));
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex<std::vector<int,std::allocator<int>>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_10c0,
             (vector<int,_std::allocator<int>_> *)local_b8,(Filtration_value *)(local_10c0 + 0x18));
  std::
  pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
  ::operator=((pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
               *)local_1a8,(type)local_10c0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_10d0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_10e0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_10d0,0x14a,&local_10e0);
    boost::test_tools::assertion_result::assertion_result
              (&local_10f8,(bool)(~(byte)returnValue.first.m_ptr & 1));
    plVar8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1128,"returnValue.second == false",0x1b);
    boost::unit_test::operator<<(&local_1118,plVar8,&local_1128);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1138,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion(&local_10f8,&local_1118,&local_1138,0x14a,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1118);
    boost::test_tools::assertion_result::~assertion_result(&local_10f8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  boost::container::
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  ::operator=(&local_e68,
              (vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
               *)local_1a8);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1148,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1158);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1148,0x14d,&local_1158);
    Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::null_simplex();
    bVar2 = boost::container::operator==(&local_e68,&local_1178);
    boost::test_tools::assertion_result::assertion_result(&local_1170,bVar2);
    plVar8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_11a8,"shReturned == typeST::null_simplex()",0x24);
    boost::unit_test::operator<<(&local_1198,plVar8,&local_11a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_11b8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion(&local_1170,&local_1198,&local_11b8,0x14d,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1198);
    boost::test_tools::assertion_result::~assertion_result(&local_1170);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_11c8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_11d8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_11c8,0x14e,&local_11d8);
    sVar9 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_vertices
                      ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_b8);
    boost::test_tools::assertion_result::assertion_result(&local_11f0,sVar9 == 4);
    plVar8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1220,"st.num_vertices() == (size_t) 4",0x1f);
    boost::unit_test::operator<<(&local_1210,plVar8,&local_1220);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1230,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion(&local_11f0,&local_1210,&local_1230,0x14e,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1210);
    boost::test_tools::assertion_result::~assertion_result(&local_11f0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1240,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1250);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1240,0x14f,&local_1250);
    iVar4 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::dimension
                      ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_b8);
    boost::test_tools::assertion_result::assertion_result(&local_1268,iVar4 == dim_max);
    plVar8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1298,"st.dimension() == dim_max",0x19);
    boost::unit_test::operator<<(&local_1288,plVar8,&local_1298);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_12a8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion(&local_1268,&local_1288,&local_12a8,0x14f,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1288);
    boost::test_tools::assertion_result::~assertion_result(&local_1268);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_12b8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_12c8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_12b8,0x150,&local_12c8);
    Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_simplices_by_dimension
              (&local_12f8,(Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_b8);
    local_1338[0] = 4;
    local_1338[1] = 4;
    local_1338[2] = 1;
    local_1320 = local_1338;
    local_1318 = 3;
    std::allocator<unsigned_long>::allocator(&local_1339);
    __l._M_len = local_1318;
    __l._M_array = local_1320;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_1310,__l,&local_1339);
    bVar2 = std::operator==(&local_12f8,&local_1310);
    boost::test_tools::assertion_result::assertion_result(&local_12e0,bVar2);
    plVar8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1370,"st.num_simplices_by_dimension() == std::vector<size_t>({4, 4, 1})",0x41)
    ;
    boost::unit_test::operator<<(&local_1360,plVar8,&local_1370);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&__range1,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion(&local_12e0,&local_1360,&__range1,0x150,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1360);
    boost::test_tools::assertion_result::~assertion_result(&local_12e0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_1310);
    std::allocator<unsigned_long>::~allocator(&local_1339);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_12f8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  poVar6 = std::operator<<((ostream *)&std::clog,"simplex_tree_insertion - first - 0");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  test_simplex_tree_contains<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<std::vector<int,std::allocator<int>>,double>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_b8,
             (pair<std::vector<int,_std::allocator<int>_>,_double> *)local_190,0);
  poVar6 = std::operator<<((ostream *)&std::clog,"simplex_tree_insertion - second - 1");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  test_simplex_tree_contains<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<std::vector<int,std::allocator<int>>,double>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_b8,
             (pair<std::vector<int,_std::allocator<int>_>,_double> *)(local_300 + 0x18),1);
  poVar6 = std::operator<<((ostream *)&std::clog,"simplex_tree_insertion - third - 4");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  test_simplex_tree_contains<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<std::vector<int,std::allocator<int>>,double>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_b8,
             (pair<std::vector<int,_std::allocator<int>_>,_double> *)(local_460 + 0x18),4);
  poVar6 = std::operator<<((ostream *)&std::clog,"simplex_tree_insertion - fourth - 2");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  test_simplex_tree_contains<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<std::vector<int,std::allocator<int>>,double>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_b8,
             (pair<std::vector<int,_std::allocator<int>_>,_double> *)(local_5b8 + 0x18),2);
  poVar6 = std::operator<<((ostream *)&std::clog,"simplex_tree_insertion - fifth - 5");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  test_simplex_tree_contains<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<std::vector<int,std::allocator<int>>,double>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_b8,
             (pair<std::vector<int,_std::allocator<int>_>,_double> *)(local_718 + 0x18),5);
  poVar6 = std::operator<<((ostream *)&std::clog,"simplex_tree_insertion - sixth - 6");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  test_simplex_tree_contains<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<std::vector<int,std::allocator<int>>,double>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_b8,
             (pair<std::vector<int,_std::allocator<int>_>,_double> *)(local_878 + 0x18),6);
  poVar6 = std::operator<<((ostream *)&std::clog,"simplex_tree_insertion - seventh - 8");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  test_simplex_tree_contains<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<std::vector<int,std::allocator<int>>,double>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_b8,
             (pair<std::vector<int,_std::allocator<int>_>,_double> *)(local_9d8 + 0x18),8);
  poVar6 = std::operator<<((ostream *)&std::clog,"simplex_tree_insertion - eighth - 3");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  test_simplex_tree_contains<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<std::vector<int,std::allocator<int>>,double>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_b8,
             (pair<std::vector<int,_std::allocator<int>_>,_double> *)(local_b30 + 0x18),3);
  poVar6 = std::operator<<((ostream *)&std::clog,"simplex_tree_insertion - ninth - 7");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  test_simplex_tree_contains<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<std::vector<int,std::allocator<int>>,double>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_b8,
             (pair<std::vector<int,_std::allocator<int>_>,_double> *)(local_c90 + 0x18),7);
  poVar6 = std::operator<<((ostream *)&std::clog,"The complex contains ");
  sVar9 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_simplices
                    ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_b8);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar9);
  poVar6 = std::operator<<(poVar6," simplices");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<((ostream *)&std::clog,"   - dimension ");
  iVar4 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::dimension
                    ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_b8);
  pvVar10 = (void *)std::ostream::operator<<(poVar6,iVar4);
  std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
  pvVar10 = (void *)std::ostream::operator<<(&std::clog,std::endl<char,std::char_traits<char>>);
  poVar6 = (ostream *)std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<(poVar6,
                           "Iterator on Simplices in the filtration, with [filtration value]:");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  this_00 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::filtration_simplex_range
                      ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_b8);
  __end0 = std::
           vector<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
           ::begin(this_00);
  f_simplex.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
        *)std::
          vector<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
          ::end(this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_*,_std::vector<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>_>
                                     *)&f_simplex), bVar2) {
    other = __gnu_cxx::
            __normal_iterator<const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_*,_std::vector<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>_>
            ::operator*(&__end0);
    boost::container::
    vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
    ::vec_iterator(&local_13a8,other);
    poVar6 = std::operator<<((ostream *)&std::clog,"   ");
    poVar6 = std::operator<<(poVar6,"[");
    boost::container::
    vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
    ::vec_iterator((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                    *)&__range2,&local_13a8);
    pFVar11 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::filtration
                        ((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                          *)&__range2);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pFVar11);
    std::operator<<(poVar6,"] ");
    boost::container::
    vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
    ::vec_iterator((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                    *)&__begin0_1.v_,&local_13a8);
    Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::simplex_vertex_range
              ((Simplex_vertex_range *)&local_13d8,
               (Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_b8,
               (Simplex_handle *)&__begin0_1.v_);
    local_13b8 = &local_13d8;
    SVar12 = boost::iterator_range_detail::
             iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
             ::begin(local_13b8);
    __end0_1._8_8_ = SVar12.sib_;
    __begin0_1.sib_._0_4_ = SVar12.v_;
    local_13f0 = (Siblings *)__end0_1._8_8_;
    SVar12 = boost::iterator_range_detail::
             iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
             ::end(local_13b8);
    local_1410 = SVar12.sib_;
    __end0_1.sib_._0_4_ = SVar12.v_;
    while (tVar3 = boost::iterators::operator!=
                             ((iterator_facade<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long>
                               *)&local_13f0,
                              (iterator_facade<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long>
                               *)&local_1410), tVar3) {
      rVar5 = boost::iterators::detail::
              iterator_facade_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long,_false,_false>
              ::operator*((iterator_facade_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long,_false,_false>
                           *)&local_13f0);
      poVar6 = (ostream *)std::ostream::operator<<(&std::clog,rVar5);
      std::operator<<(poVar6," ");
      boost::iterators::detail::
      iterator_facade_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long,_false,_false>
      ::operator++((iterator_facade_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long,_false,_false>
                    *)&local_13f0);
    }
    std::ostream::operator<<(&std::clog,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_*,_std::vector<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>_>
    ::operator++(&__end0);
  }
  std::pair<std::vector<int,_std::allocator<int>_>,_double>::~pair
            ((pair<std::vector<int,_std::allocator<int>_>,_double> *)(local_10c0 + 0x18));
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_ff0);
  std::pair<std::vector<int,_std::allocator<int>_>,_double>::~pair
            ((pair<std::vector<int,_std::allocator<int>_>,_double> *)(local_de8 + 0x18));
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_d20);
  std::pair<std::vector<int,_std::allocator<int>_>,_double>::~pair
            ((pair<std::vector<int,_std::allocator<int>_>,_double> *)(local_c90 + 0x18));
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_bc0);
  std::pair<std::vector<int,_std::allocator<int>_>,_double>::~pair
            ((pair<std::vector<int,_std::allocator<int>_>,_double> *)(local_b30 + 0x18));
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_a68);
  std::pair<std::vector<int,_std::allocator<int>_>,_double>::~pair
            ((pair<std::vector<int,_std::allocator<int>_>,_double> *)(local_9d8 + 0x18));
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_908);
  std::pair<std::vector<int,_std::allocator<int>_>,_double>::~pair
            ((pair<std::vector<int,_std::allocator<int>_>,_double> *)(local_878 + 0x18));
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_7a8);
  std::pair<std::vector<int,_std::allocator<int>_>,_double>::~pair
            ((pair<std::vector<int,_std::allocator<int>_>,_double> *)(local_718 + 0x18));
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_648);
  std::pair<std::vector<int,_std::allocator<int>_>,_double>::~pair
            ((pair<std::vector<int,_std::allocator<int>_>,_double> *)(local_5b8 + 0x18));
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_4f0);
  std::pair<std::vector<int,_std::allocator<int>_>,_double>::~pair
            ((pair<std::vector<int,_std::allocator<int>_>,_double> *)(local_460 + 0x18));
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_390);
  std::pair<std::vector<int,_std::allocator<int>_>,_double>::~pair
            ((pair<std::vector<int,_std::allocator<int>_>,_double> *)(local_300 + 0x18));
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_238);
  std::pair<std::vector<int,_std::allocator<int>_>,_double>::~pair
            ((pair<std::vector<int,_std::allocator<int>_>,_double> *)local_190);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_e0);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::~Simplex_tree
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_b8);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(simplex_tree_insertion, typeST, list_of_tested_variants) {
  typedef typename typeST::Filtration_value Filtration_value;
  typedef std::pair<typename typeST::Simplex_handle, bool> typePairSimplexBool;
  typedef std::vector<typename typeST::Vertex_handle> typeVectorVertex;
  typedef std::pair<typeVectorVertex, Filtration_value> typeSimplex;
  const Filtration_value FIRST_FILTRATION_VALUE = 0.1;
  const Filtration_value SECOND_FILTRATION_VALUE = 0.2;
  const Filtration_value THIRD_FILTRATION_VALUE = 0.3;
  const Filtration_value FOURTH_FILTRATION_VALUE = 0.4;
  // reset since we run the test several times
  dim_max = -1;

  // TEST OF INSERTION
  std::clog << "********************************************************************" << std::endl;
  std::clog << "TEST OF INSERTION" << std::endl;
  typeST st;

  // ++ FIRST
  std::clog << "   - INSERT 0" << std::endl;
  typeVectorVertex firstSimplexVector{0};
  BOOST_CHECK(firstSimplexVector.size() == 1);
  typeSimplex firstSimplex = std::make_pair(firstSimplexVector, Filtration_value(FIRST_FILTRATION_VALUE));
  typePairSimplexBool returnValue = st.insert_simplex(firstSimplex.first, firstSimplex.second);

  test_simplex_tree_insert_returns_true<typeST>(returnValue);
  set_and_test_simplex_tree_dim_fil(st, firstSimplexVector.size(), firstSimplex.second);
  BOOST_CHECK(st.num_vertices() == (size_t) 1);

  // ++ SECOND
  std::clog << "   - INSERT 1" << std::endl;
  typeVectorVertex secondSimplexVector{1};
  BOOST_CHECK(secondSimplexVector.size() == 1);
  typeSimplex secondSimplex = std::make_pair(secondSimplexVector, Filtration_value(FIRST_FILTRATION_VALUE));
  returnValue = st.insert_simplex(secondSimplex.first, secondSimplex.second);

  test_simplex_tree_insert_returns_true<typeST>(returnValue);
  set_and_test_simplex_tree_dim_fil(st, secondSimplexVector.size(), secondSimplex.second);
  BOOST_CHECK(st.num_vertices() == (size_t) 2);

  // ++ THIRD
  std::clog << "   - INSERT (0,1)" << std::endl;
  typeVectorVertex thirdSimplexVector{0, 1};
  BOOST_CHECK(thirdSimplexVector.size() == 2);
  typeSimplex thirdSimplex = std::make_pair(thirdSimplexVector, Filtration_value(SECOND_FILTRATION_VALUE));
  returnValue = st.insert_simplex(thirdSimplex.first, thirdSimplex.second);

  test_simplex_tree_insert_returns_true<typeST>(returnValue);
  set_and_test_simplex_tree_dim_fil(st, thirdSimplexVector.size(), thirdSimplex.second);
  BOOST_CHECK(st.num_vertices() == (size_t) 2); // Not incremented !!

  // ++ FOURTH
  std::clog << "   - INSERT 2" << std::endl;
  typeVectorVertex fourthSimplexVector{2};
  BOOST_CHECK(fourthSimplexVector.size() == 1);
  typeSimplex fourthSimplex = std::make_pair(fourthSimplexVector, Filtration_value(FIRST_FILTRATION_VALUE));
  returnValue = st.insert_simplex(fourthSimplex.first, fourthSimplex.second);

  test_simplex_tree_insert_returns_true<typeST>(returnValue);
  set_and_test_simplex_tree_dim_fil(st, fourthSimplexVector.size(), fourthSimplex.second);
  BOOST_CHECK(st.num_vertices() == (size_t) 3);

  // ++ FIFTH
  std::clog << "   - INSERT (2,0)" << std::endl;
  typeVectorVertex fifthSimplexVector{2, 0};
  BOOST_CHECK(fifthSimplexVector.size() == 2);
  typeSimplex fifthSimplex = std::make_pair(fifthSimplexVector, Filtration_value(SECOND_FILTRATION_VALUE));
  returnValue = st.insert_simplex(fifthSimplex.first, fifthSimplex.second);

  test_simplex_tree_insert_returns_true<typeST>(returnValue);
  set_and_test_simplex_tree_dim_fil(st, fifthSimplexVector.size(), fifthSimplex.second);
  BOOST_CHECK(st.num_vertices() == (size_t) 3); // Not incremented !!

  // ++ SIXTH
  std::clog << "   - INSERT (2,1)" << std::endl;
  typeVectorVertex sixthSimplexVector{2, 1};
  BOOST_CHECK(sixthSimplexVector.size() == 2);
  typeSimplex sixthSimplex = std::make_pair(sixthSimplexVector, Filtration_value(SECOND_FILTRATION_VALUE));
  returnValue = st.insert_simplex(sixthSimplex.first, sixthSimplex.second);

  test_simplex_tree_insert_returns_true<typeST>(returnValue);
  set_and_test_simplex_tree_dim_fil(st, sixthSimplexVector.size(), sixthSimplex.second);
  BOOST_CHECK(st.num_vertices() == (size_t) 3); // Not incremented !!

  // ++ SEVENTH
  std::clog << "   - INSERT (2,1,0)" << std::endl;
  typeVectorVertex seventhSimplexVector{2, 1, 0};
  BOOST_CHECK(seventhSimplexVector.size() == 3);
  typeSimplex seventhSimplex = std::make_pair(seventhSimplexVector, Filtration_value(THIRD_FILTRATION_VALUE));
  returnValue = st.insert_simplex(seventhSimplex.first, seventhSimplex.second);

  test_simplex_tree_insert_returns_true<typeST>(returnValue);
  set_and_test_simplex_tree_dim_fil(st, seventhSimplexVector.size(), seventhSimplex.second);
  BOOST_CHECK(st.num_vertices() == (size_t) 3); // Not incremented !!

  // ++ EIGHTH
  std::clog << "   - INSERT 3" << std::endl;
  typeVectorVertex eighthSimplexVector{3};
  BOOST_CHECK(eighthSimplexVector.size() == 1);
  typeSimplex eighthSimplex = std::make_pair(eighthSimplexVector, Filtration_value(FIRST_FILTRATION_VALUE));
  returnValue = st.insert_simplex(eighthSimplex.first, eighthSimplex.second);

  test_simplex_tree_insert_returns_true<typeST>(returnValue);
  set_and_test_simplex_tree_dim_fil(st, eighthSimplexVector.size(), eighthSimplex.second);
  BOOST_CHECK(st.num_vertices() == (size_t) 4);

  // ++ NINTH
  std::clog << "   - INSERT (3,0)" << std::endl;
  typeVectorVertex ninethSimplexVector{3, 0};
  BOOST_CHECK(ninethSimplexVector.size() == 2);
  typeSimplex ninethSimplex = std::make_pair(ninethSimplexVector, Filtration_value(SECOND_FILTRATION_VALUE));
  returnValue = st.insert_simplex(ninethSimplex.first, ninethSimplex.second);

  test_simplex_tree_insert_returns_true<typeST>(returnValue);
  set_and_test_simplex_tree_dim_fil(st, ninethSimplexVector.size(), ninethSimplex.second);
  BOOST_CHECK(st.num_vertices() == (size_t) 4); // Not incremented !!

  // ++ TENTH
  std::clog << "   - INSERT 0 (already inserted)" << std::endl;
  typeVectorVertex tenthSimplexVector{0};
  BOOST_CHECK(tenthSimplexVector.size() == 1);
  // With a different filtration value
  typeSimplex tenthSimplex = std::make_pair(tenthSimplexVector, Filtration_value(FOURTH_FILTRATION_VALUE));
  returnValue = st.insert_simplex(tenthSimplex.first, tenthSimplex.second);

  BOOST_CHECK(returnValue.second == false);
  // Simplex_handle = boost::container::flat_map< typeST::Vertex_handle, Node >::iterator
  typename typeST::Simplex_handle shReturned = returnValue.first;
  BOOST_CHECK(shReturned == typeST::null_simplex());
  std::clog << "st.num_vertices()=" << st.num_vertices() << std::endl;
  BOOST_CHECK(st.num_vertices() == (size_t) 4); // Not incremented !!
  BOOST_CHECK(st.dimension() == dim_max);

  // ++ ELEVENTH
  std::clog << "   - INSERT (2,1,0) (already inserted)" << std::endl;
  typeVectorVertex eleventhSimplexVector{2, 1, 0};
  BOOST_CHECK(eleventhSimplexVector.size() == 3);
  typeSimplex eleventhSimplex = std::make_pair(eleventhSimplexVector, Filtration_value(FOURTH_FILTRATION_VALUE));
  returnValue = st.insert_simplex(eleventhSimplex.first, eleventhSimplex.second);

  BOOST_CHECK(returnValue.second == false);
  // Simplex_handle = boost::container::flat_map< typeST::Vertex_handle, Node >::iterator
  shReturned = returnValue.first;
  BOOST_CHECK(shReturned == typeST::null_simplex());
  BOOST_CHECK(st.num_vertices() == (size_t) 4); // Not incremented !!
  BOOST_CHECK(st.dimension() == dim_max);
  BOOST_CHECK(st.num_simplices_by_dimension() == std::vector<size_t>({4, 4, 1}));

  /* Inserted simplex:        */
  /*    1                     */
  /*    o                     */
  /*   /X\                    */
  /*  o---o---o               */
  /*  2   0   3               */

  //   [0.1] 0
  //   [0.1] 1
  //   [0.1] 2
  //   [0.1] 3
  //   [0.2] 1 0
  //   [0.2] 2 0
  //   [0.2] 2 1
  //   [0.2] 3 0
  //   [0.3] 2 1 0
  //  !! Be careful, simplex are sorted by filtration value on insertion !!
  std::clog << "simplex_tree_insertion - first - 0" << std::endl;
  test_simplex_tree_contains(st, firstSimplex, 0); // (0) -> 0
  std::clog << "simplex_tree_insertion - second - 1" << std::endl;
  test_simplex_tree_contains(st, secondSimplex, 1); // (1) -> 1
  std::clog << "simplex_tree_insertion - third - 4" << std::endl;
  test_simplex_tree_contains(st, thirdSimplex, 4); // (0,1) -> 4
  std::clog << "simplex_tree_insertion - fourth - 2" << std::endl;
  test_simplex_tree_contains(st, fourthSimplex, 2); // (2) -> 2
  std::clog << "simplex_tree_insertion - fifth - 5" << std::endl;
  test_simplex_tree_contains(st, fifthSimplex, 5); // (2,0) -> 5
  std::clog << "simplex_tree_insertion - sixth - 6" << std::endl;
  test_simplex_tree_contains(st, sixthSimplex, 6); //(2,1) -> 6
  std::clog << "simplex_tree_insertion - seventh - 8" << std::endl;
  test_simplex_tree_contains(st, seventhSimplex, 8); // (2,1,0) -> 8
  std::clog << "simplex_tree_insertion - eighth - 3" << std::endl;
  test_simplex_tree_contains(st, eighthSimplex, 3); // (3) -> 3
  std::clog << "simplex_tree_insertion - ninth - 7" << std::endl;
  test_simplex_tree_contains(st, ninethSimplex, 7); // (3,0) -> 7

  // Display the Simplex_tree - Can not be done in the middle of 2 inserts
  std::clog << "The complex contains " << st.num_simplices() << " simplices" << std::endl;
  std::clog << "   - dimension " << st.dimension() << std::endl;
  std::clog << std::endl << std::endl << "Iterator on Simplices in the filtration, with [filtration value]:" << std::endl;
  for (auto f_simplex : st.filtration_simplex_range()) {
    std::clog << "   " << "[" << st.filtration(f_simplex) << "] ";
    for (auto vertex : st.simplex_vertex_range(f_simplex)) {
      std::clog << (int) vertex << " ";
    }
    std::clog << std::endl;
  }

}